

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void __thiscall
duckdb::RLECompressState<duckdb::uhugeint_t,_true>::CreateEmptySegment
          (RLECompressState<duckdb::uhugeint_t,_true> *this,idx_t row_start)

{
  CompressionFunction *function;
  undefined8 __p;
  DatabaseInstance *db;
  LogicalType *type;
  idx_t segment_size;
  BufferManager *pBVar1;
  pointer pCVar2;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> column_segment
  ;
  undefined1 local_50 [32];
  
  db = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  type = ColumnDataCheckpointData::GetType(this->checkpoint_data);
  function = this->function;
  segment_size = CompressionInfo::GetBlockSize(&(this->super_CompressionState).info);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)local_50,db,function,type,row_start,segment_size,
             (this->super_CompressionState).info.block_manager);
  __p = local_50._0_8_;
  local_50._0_8_ =
       (__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::reset
            ((__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &this->current_segment,(pointer)__p);
  pBVar1 = BufferManager::GetBufferManager(db);
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  (*pBVar1->_vptr_BufferManager[7])(local_50 + 8,pBVar1,&pCVar2->block);
  BufferHandle::operator=(&this->handle,(BufferHandle *)(local_50 + 8));
  BufferHandle::~BufferHandle((BufferHandle *)(local_50 + 8));
  ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             local_50);
  return;
}

Assistant:

void CreateEmptySegment(idx_t row_start) {
		auto &db = checkpoint_data.GetDatabase();
		auto &type = checkpoint_data.GetType();

		auto column_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start, info.GetBlockSize(),
		                                                            info.GetBlockManager());
		current_segment = std::move(column_segment);

		auto &buffer_manager = BufferManager::GetBufferManager(db);
		handle = buffer_manager.Pin(current_segment->block);
	}